

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Button.cpp
# Opt level: O1

shared_ptr<gui::Button> __thiscall gui::Button::create(Button *this,Theme *theme,String *name)

{
  Button *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Button> sVar1;
  locale alStack_68 [8];
  shared_ptr<gui::ButtonStyle> local_60;
  String local_50;
  
  this_00 = (Button *)operator_new(0x2d0);
  std::locale::locale(alStack_68);
  sf::String::String(&local_50,"Button",alStack_68);
  Theme::getStyle<gui::ButtonStyle>((Theme *)&local_60,(String *)theme);
  Button(this_00,&local_60,name);
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<gui::Button*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_Widget).super_enable_shared_from_this<gui::Widget>,this_00);
  std::__shared_ptr<gui::Button,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<gui::Button,gui::Button>
            ((__shared_ptr<gui::Button,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  if ((Gui *)local_60.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi != (Gui *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(alStack_68);
  sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Button>)sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Button> Button::create(const Theme& theme, const sf::String& name) {
    // Note that we do not use `std::make_shared` here due to the protected
    // constructor. A workaround is adding a private empty class as a parameter
    // to a public constructor (to ensure construction is still actually
    // private), but that should be unnecessary. Using the call to `new` here
    // does not cause any exception safety problems or possible leaks.
    // For details see: https://herbsutter.com/gotw/_102/
    return std::shared_ptr<Button>(new Button(theme.getStyle<ButtonStyle>("Button"), name));
}